

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O0

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollState::~LoopUnrollState(LoopUnrollState *this)

{
  LoopUnrollState *this_local;
  
  std::
  unordered_map<unsigned_int,_spvtools::opt::Instruction_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>
  ::~unordered_map(&this->ids_to_new_inst);
  std::
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  ::~unordered_map(&this->new_inst);
  std::
  unordered_map<unsigned_int,_spvtools::opt::BasicBlock_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::BasicBlock_*>_>_>
  ::~unordered_map(&this->new_blocks);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            (&this->new_phis_);
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::~vector
            (&this->previous_phis_);
  return;
}

Assistant:

LoopUnrollState()
      : previous_phi_(nullptr),
        previous_latch_block_(nullptr),
        previous_condition_block_(nullptr),
        new_phi(nullptr),
        new_continue_block(nullptr),
        new_condition_block(nullptr),
        new_header_block(nullptr) {}